

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytraced_renderer.cpp
# Opt level: O0

void __thiscall CGL::RaytracedRenderer::clear(RaytracedRenderer *this)

{
  BVHAccel *this_00;
  size_t in_RDI;
  ImageBuffer *unaff_retaddr;
  size_t w;
  
  if (*(int *)(in_RDI + 0x38) == 1) {
    this_00 = *(BVHAccel **)(in_RDI + 0xd8);
    w = in_RDI;
    if (this_00 != (BVHAccel *)0x0) {
      CGL::SceneObjects::BVHAccel::~BVHAccel(this_00);
      operator_delete(this_00);
    }
    *(undefined8 *)(in_RDI + 0xd8) = 0;
    *(undefined8 *)(in_RDI + 0x40) = 0;
    *(undefined8 *)(in_RDI + 0x48) = 0;
    std::
    stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
    ::pop((stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
           *)0x151d02);
    ImageBuffer::resize(unaff_retaddr,w,in_RDI);
    *(undefined4 *)(in_RDI + 0x38) = 0;
    *(undefined1 *)(in_RDI + 0x28) = 0;
    CGL::PathTracer::clear();
  }
  return;
}

Assistant:

void RaytracedRenderer::clear() {
  if (state != READY) return;
  delete bvh;
  bvh = NULL;
  scene = NULL;
  camera = NULL;
  selectionHistory.pop();
  frameBuffer.resize(0, 0);
  state = INIT;
  render_cell = false;

  pt->clear();
}